

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hyperplane_Reorderer.cpp
# Opt level: O0

string * __thiscall
mpireorderinglib::Hyperplane_Reorderer::get_name_abi_cxx11_(Hyperplane_Reorderer *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 8));
  return in_RDI;
}

Assistant:

std::string mpireorderinglib::Hyperplane_Reorderer::get_name() {
  return name;
}